

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

string * __thiscall
EthUdpPort::IP_String_abi_cxx11_(string *__return_storage_ptr__,EthUdpPort *this,uint32_t IPaddr)

{
  allocator<char> local_29;
  char local_28 [8];
  char IPstr [16];
  uint32_t IPaddr_local;
  
  IPstr._12_4_ = SUB84(this,0);
  inet_ntop(2,IPstr + 0xc,local_28,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_28,&local_29);
  std::allocator<char>::~allocator(&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string EthUdpPort::IP_String(uint32_t IPaddr)
{
    char IPstr[INET_ADDRSTRLEN];
#ifdef _MSC_VER
    // Windows does not provide inet_ntop prior to Vista, so we use inet_ntoa.
    strncpy(IPstr, inet_ntoa(*reinterpret_cast<const struct in_addr *>(&IPaddr)), INET_ADDRSTRLEN);
#else
    inet_ntop(AF_INET, reinterpret_cast<const struct in_addr *>(&IPaddr), IPstr, INET_ADDRSTRLEN);
#endif
    return std::string(IPstr);
}